

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O2

void __thiscall wabt::anon_unknown_0::CWriter::Spill(CWriter *this,TypeVector *types)

{
  Type type;
  byte bVar1;
  pointer pTVar2;
  const_reference pvVar3;
  pointer args;
  uint uVar4;
  char (*u) [2];
  long lVar5;
  Newline *in_R8;
  ulong __n;
  StackVar local_38;
  
  args = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pTVar2 - (long)args >> 3;
  if (lVar5 == 1) {
    local_38.index = (int)((ulong)((long)pTVar2 - (long)args) >> 3) - 1;
    local_38.type.enum_ = Any;
    local_38.type.type_index_ = 0;
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[7],wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
              ((CWriter *)this,(char (*) [7])&local_38,(StackVar *)(ulong)local_38.index,
               (char (*) [2])args,in_R8);
  }
  else {
    if (lVar5 == 0) {
      __assert_fail("types.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0xba2,
                    "void wabt::(anonymous namespace)::CWriter::Spill(const TypeVector &, const sources &) [sources = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2992:16)]"
                   );
    }
    for (uVar4 = 0; __n = (ulong)uVar4, __n < (ulong)((long)pTVar2 - (long)args >> 3);
        uVar4 = uVar4 + 1) {
      pvVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::at(types,__n);
      type.enum_ = pvVar3->enum_;
      type.type_index_ = pvVar3->type_index_;
      bVar1 = MangleType(type);
      Writef(this,"tmp.%c%d = ",(ulong)bVar1,__n);
      local_38.index =
           (int)((ulong)((long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 3) + ~uVar4;
      local_38.type.enum_ = Any;
      local_38.type.type_index_ = 0;
      (anonymous_namespace)::CWriter::
      Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,&local_38,u,(Newline *)(ulong)~uVar4);
      args = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
      pTVar2 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    }
  }
  return;
}

Assistant:

void CWriter::Spill(const TypeVector& types) {
  Spill(types, [&](auto i) { return StackVar(types.size() - i - 1); });
}